

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

Matrix3d * __thiscall
ear::QuadRegion::_calcPolyBasis
          (Matrix3d *__return_storage_ptr__,QuadRegion *this,MatrixXd *positions)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  Vector3d d;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1b8;
  Vector3d a;
  Matrix3d polyBasis;
  double local_138;
  double dStack_130;
  double local_128;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_120;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_118;
  type local_108;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_f0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_e8;
  type local_d8;
  type *local_c0;
  type *local_b8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_a8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_a0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_90;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_88;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_78 [24];
  Vector3d c;
  Vector3d b;
  
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&polyBasis,positions,0
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             &polyBasis);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&polyBasis,positions,1
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&b,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             &polyBasis);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&polyBasis,positions,2
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&c,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             &polyBasis);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&polyBasis,positions,3
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             &polyBasis);
  local_a8 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&c;
  local_a0 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d;
  local_90 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&b;
  local_88 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::
  cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((type *)local_78,&local_90,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a8);
  Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::
  CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>
            ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)&local_1b8,&polyBasis,local_78);
  local_f0 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&c;
  local_e8 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
  cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_d8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_f0);
  local_120 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&b;
  local_118 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_108,&local_120,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&d);
  local_c0 = &local_d8;
  local_b8 = &local_108;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)&local_1b8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_c0);
  local_138 = d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [2] * a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1] -
              a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [2] * d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1];
  dStack_130 = d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] * a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2] -
               a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0] * d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2];
  local_128 = a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1] -
              d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1];
  Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)this_00,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_138);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_1b8);
  local_1b8.m_xpr = &polyBasis;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d QuadRegion::_calcPolyBasis(Eigen::MatrixXd positions) {
    Eigen::Vector3d a = positions.row(0);
    Eigen::Vector3d b = positions.row(1);
    Eigen::Vector3d c = positions.row(2);
    Eigen::Vector3d d = positions.row(3);

    Eigen::Matrix3d polyBasis;
    polyBasis <<  //
        (b - a).cross(c - d),  //
        a.cross(c - d) + (b - a).cross(d),  //
        a.cross(d);

    return polyBasis.transpose();
  }